

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalNinjaGenerator::WriteTargetHelp(cmGlobalNinjaGenerator *this,ostream *os)

{
  ostream *os_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmNinjaRule rule;
  string local_200;
  ostream *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  char *local_1b8;
  size_type local_1b0;
  char local_1a8;
  uint7 uStack_1a7;
  undefined8 uStack_1a0;
  string local_198;
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Alloc_hider local_118;
  pointer local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  pointer local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  pointer local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  pointer local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  pointer local_90;
  undefined1 local_88 [16];
  _Alloc_hider local_78;
  _Base_ptr local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  bool local_38;
  
  local_1b8 = &local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"HELP","");
  if (local_1b8 == &local_1a8) {
    local_158._24_8_ = uStack_1a0;
    local_158._0_8_ = local_158 + 0x10;
  }
  else {
    local_158._0_8_ = local_1b8;
  }
  local_158._16_8_ = (ulong)uStack_1a7 << 8;
  local_158._8_8_ = local_1b0;
  local_1b0 = 0;
  local_1a8 = '\0';
  local_130 = 0;
  local_128._M_allocated_capacity = local_128._M_allocated_capacity & 0xffffffffffffff00;
  local_118._M_p = (pointer)&local_108;
  local_110 = (pointer)0x0;
  local_108._M_local_buf[0] = '\0';
  local_f8._M_p = (pointer)&local_e8;
  local_f0 = (pointer)0x0;
  local_e8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = (pointer)0x0;
  local_c8._M_local_buf[0] = '\0';
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = (pointer)0x0;
  local_a8._M_local_buf[0] = '\0';
  local_98._M_p = local_88;
  local_90 = (pointer)0x0;
  local_88[0] = '\0';
  local_78._M_p = (pointer)&local_68;
  local_70 = (_Base_ptr)0x0;
  local_68._M_allocated_capacity = local_68._M_allocated_capacity & 0xffffffffffffff00;
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  local_38 = false;
  local_1b8 = &local_1a8;
  local_138._M_p = (pointer)&local_128;
  local_58._M_p = (pointer)&local_48;
  NinjaCmd_abi_cxx11_(&local_198,this);
  local_178._0_8_ = local_198._M_string_length;
  local_178._8_8_ = local_198._M_dataplus._M_p;
  local_178._16_8_ = 0xb;
  local_178._24_8_ = " -t targets";
  views._M_len = 2;
  views._M_array = (iterator)local_178;
  cmCatViews_abi_cxx11_(&local_200,views);
  std::__cxx11::string::operator=((string *)&local_138,(string *)&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  local_1e0 = os;
  std::__cxx11::string::_M_replace((ulong)&local_118,0,(char *)local_110,0x717761);
  std::__cxx11::string::_M_replace((ulong)&local_f8,0,(char *)local_f0,0x717780);
  WriteRule((ostream *)
            (this->RulesFileStream)._M_t.
            super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
            .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
            (cmNinjaRule *)local_158);
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_158);
  local_1d8 = &local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"HELP","");
  local_158._8_8_ = (char *)0x0;
  local_158._16_8_ = local_158._16_8_ & 0xffffffffffffff00;
  if (local_1d8 == &local_1c8) {
    local_128._8_8_ = local_1c8._8_8_;
    local_138._M_p = (pointer)&local_128;
  }
  else {
    local_138._M_p = (pointer)local_1d8;
  }
  local_130 = local_1d0;
  local_1d0 = 0;
  local_1c8._M_local_buf[0] = '\0';
  local_88._8_4_ = 0;
  local_78._M_p = (pointer)0x0;
  local_1d8 = &local_1c8;
  local_158._0_8_ = local_158 + 0x10;
  memset((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,0,0x90);
  local_68._8_8_ = 0;
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  local_70 = (_Base_ptr)(local_88 + 8);
  local_68._M_allocated_capacity = (size_type)(_Base_ptr)(local_88 + 8);
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_replace((ulong)local_158,0,(char *)local_158._8_8_,0x7177b1);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"help","");
  os_00 = local_1e0;
  NinjaOutputPath((string *)local_178,this,&local_200);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
  if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  WriteBuild(this,os_00,(cmNinjaBuild *)local_158,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_158);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetHelp(std::ostream& os)
{
  {
    cmNinjaRule rule("HELP");
    rule.Command = cmStrCat(this->NinjaCmd(), " -t targets");
    rule.Description = "All primary targets available:";
    rule.Comment = "Rule for printing all primary targets available.";
    WriteRule(*this->RulesFileStream, rule);
  }
  {
    cmNinjaBuild build("HELP");
    build.Comment = "Print all primary targets available.";
    build.Outputs.push_back(this->NinjaOutputPath("help"));
    this->WriteBuild(os, build);
  }
}